

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_traversal.c
# Opt level: O1

void * append_new(t_symbol *why,int argc,t_atom *argv)

{
  t_object *owner;
  t_symbol *ptVar1;
  _outlet *p_Var2;
  void *pvVar3;
  uint argc_00;
  uint which;
  t_atom *argv_00;
  t_float *fp;
  t_atom at;
  t_atom local_38;
  
  argv_00 = &local_38;
  owner = (t_object *)pd_new(append_class);
  ptVar1 = atom_getsymbolarg(0,argc,argv);
  p_Var2 = (_outlet *)template_getbindsym(ptVar1);
  owner[1].te_outlet = p_Var2;
  if (argc < 2) {
    local_38.a_type = A_SYMBOL;
    local_38.a_w.w_symbol = &s_;
    argc_00 = 1;
  }
  else {
    argc_00 = argc - 1;
    argv_00 = argv + 1;
  }
  pvVar3 = getbytes((ulong)argc_00 << 4);
  *(void **)&owner[1].te_xpix = pvVar3;
  *(uint *)&owner[1].te_inlet = argc_00;
  if (0 < (int)argc_00) {
    fp = (t_float *)((long)pvVar3 + 8);
    which = 0;
    do {
      ptVar1 = atom_getsymbolarg(which,argc_00,argv_00);
      *(t_symbol **)(fp + -2) = ptVar1;
      *fp = 0.0;
      if (which != 0) {
        floatinlet_new(owner,fp);
      }
      which = which + 1;
      fp = fp + 4;
    } while (argc_00 != which);
  }
  pointerinlet_new(owner,(t_gpointer *)(owner + 1));
  outlet_new(owner,&s_pointer);
  gpointer_init((t_gpointer *)(owner + 1));
  return owner;
}

Assistant:

static void *append_new(t_symbol *why, int argc, t_atom *argv)
{
    t_append *x = (t_append *)pd_new(append_class);
    int varcount, i;
    t_atom at, *varvec;
    t_appendvariable *sp;

    x->x_templatesym = template_getbindsym(atom_getsymbolarg(0, argc, argv));
    if (argc < 2)
    {
        varcount = 1;
        varvec = &at;
        SETSYMBOL(&at, &s_);
    }
    else varcount = argc - 1, varvec = argv + 1;
    x->x_variables
        = (t_appendvariable *)getbytes(varcount * sizeof (*x->x_variables));
    x->x_nin = varcount;
    for (i = 0, sp = x->x_variables; i < varcount; i++, sp++)
    {
        sp->gv_sym = atom_getsymbolarg(i, varcount, varvec);
        sp->gv_f = 0;
        if (i) floatinlet_new(&x->x_obj, &sp->gv_f);
    }
    pointerinlet_new(&x->x_obj, &x->x_gp);
    outlet_new(&x->x_obj, &s_pointer);
    gpointer_init(&x->x_gp);
    return (x);
}